

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O1

rect<int> __thiscall
irr::gui::CGUISkin::draw3DWindowBackground
          (CGUISkin *this,IGUIElement *element,bool drawTitleBar,SColor titleBarColor,rect<int> *r,
          rect<int> *clip,rect<int> *checkClientArea)

{
  vector2d<int> vVar1;
  rect<int> rVar2;
  vector2d<int> vVar3;
  uint uVar4;
  SColor SVar5;
  SColor SVar6;
  int iVar7;
  SColor SVar8;
  undefined7 in_register_00000011;
  IVideoDriver *pIVar9;
  _func_int **pp_Var10;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  SColor local_58;
  SColor local_54;
  undefined4 local_50;
  SColor local_4c;
  vector2d<int> local_48;
  undefined8 uStack_40;
  
  pIVar9 = this->Driver;
  if (pIVar9 == (IVideoDriver *)0x0) {
    if (checkClientArea != (rect<int> *)0x0) {
      vVar1 = r->LowerRightCorner;
      checkClientArea->UpperLeftCorner = r->UpperLeftCorner;
      checkClientArea->LowerRightCorner = vVar1;
    }
    local_68 = (r->UpperLeftCorner).X;
    iStack_64 = (r->UpperLeftCorner).Y;
    iStack_60 = (r->LowerRightCorner).X;
    iStack_5c = (r->LowerRightCorner).Y;
  }
  else {
    local_50 = (undefined4)CONCAT71(in_register_00000011,drawTitleBar);
    local_68 = (r->UpperLeftCorner).X;
    iStack_64 = (r->UpperLeftCorner).Y;
    iStack_60 = (r->LowerRightCorner).X;
    iStack_5c = iStack_64 + 1;
    local_54.color = titleBarColor.color;
    if (checkClientArea == (rect<int> *)0x0) {
      uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
      (*pIVar9->_vptr_IVideoDriver[0x33])(pIVar9,(ulong)uVar4,&local_68,clip);
    }
    iStack_60 = local_68 + 1;
    iStack_5c = (r->LowerRightCorner).Y;
    if (checkClientArea == (rect<int> *)0x0) {
      pIVar9 = this->Driver;
      uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,3);
      (*pIVar9->_vptr_IVideoDriver[0x33])(pIVar9,(ulong)uVar4,&local_68,clip);
      iStack_64 = (r->UpperLeftCorner).Y;
      iStack_60 = (r->LowerRightCorner).X;
      local_68 = iStack_60 + -1;
      iStack_5c = (r->LowerRightCorner).Y;
      pIVar9 = this->Driver;
      uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0);
      (*pIVar9->_vptr_IVideoDriver[0x33])(pIVar9,(ulong)uVar4,&local_68,clip);
    }
    else {
      iStack_60 = (r->LowerRightCorner).X;
      local_68 = iStack_60 + -1;
      iStack_64 = (r->UpperLeftCorner).Y;
    }
    local_68 = local_68 + -1;
    iStack_64 = iStack_64 + 1;
    iStack_60 = iStack_60 + -1;
    iStack_5c = iStack_5c + -1;
    if (checkClientArea == (rect<int> *)0x0) {
      pIVar9 = this->Driver;
      uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
      (*pIVar9->_vptr_IVideoDriver[0x33])(pIVar9,(ulong)uVar4,&local_68,clip);
      local_68 = (r->UpperLeftCorner).X;
      iStack_5c = (r->LowerRightCorner).Y;
      iStack_64 = iStack_5c + -1;
      iStack_60 = (r->LowerRightCorner).X;
      pIVar9 = this->Driver;
      uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0);
      (*pIVar9->_vptr_IVideoDriver[0x33])(pIVar9,(ulong)uVar4,&local_68,clip);
    }
    else {
      local_68 = (r->UpperLeftCorner).X;
      iStack_5c = (r->LowerRightCorner).Y;
      iStack_64 = iStack_5c + -1;
      iStack_60 = (r->LowerRightCorner).X;
    }
    local_68 = local_68 + 1;
    iStack_64 = iStack_64 + -1;
    iStack_60 = iStack_60 + -1;
    iStack_5c = iStack_5c + -1;
    if (checkClientArea == (rect<int> *)0x0) {
      pIVar9 = this->Driver;
      uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
      (*pIVar9->_vptr_IVideoDriver[0x33])(pIVar9,(ulong)uVar4,&local_68,clip);
      local_68 = (r->UpperLeftCorner).X;
      iStack_64 = (r->UpperLeftCorner).Y;
      iStack_60 = (r->LowerRightCorner).X;
      iStack_5c = (r->LowerRightCorner).Y;
      local_68 = local_68 + 1;
      iStack_64 = iStack_64 + 1;
      iStack_60 = iStack_60 + -2;
      iStack_5c = iStack_5c + -2;
      if (this->UseGradient == false) {
        pIVar9 = this->Driver;
        uVar4 = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
        (*pIVar9->_vptr_IVideoDriver[0x33])(pIVar9,(ulong)uVar4,&local_68,clip);
      }
      else {
        if (this->Type == EGST_BURNING_SKIN) {
          local_58.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0x11);
          local_4c.color = 0xffffffff;
          SVar5 = video::SColor::getInterpolated(&local_58,&local_4c,0.9);
          local_58.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,0x11);
          local_4c.color = 0xffffffff;
          SVar8 = video::SColor::getInterpolated(&local_58,&local_4c,0.8);
          pIVar9 = this->Driver;
          pp_Var10 = pIVar9->_vptr_IVideoDriver;
          SVar6 = SVar8;
        }
        else {
          SVar8.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,1);
          SVar5.color = (**(this->super_IGUISkin)._vptr_IGUISkin)(this,2);
          pIVar9 = this->Driver;
          pp_Var10 = pIVar9->_vptr_IVideoDriver;
          SVar6.color = SVar5.color;
        }
        (*pp_Var10[0x34])(pIVar9,&local_68,(ulong)SVar5.color,(ulong)SVar5.color,(ulong)SVar6.color,
                          (ulong)SVar8.color,clip);
      }
    }
    else {
      local_68 = (r->UpperLeftCorner).X;
      iStack_64 = (r->UpperLeftCorner).Y;
      iStack_60 = (r->LowerRightCorner).X;
      iStack_5c = (r->LowerRightCorner).Y;
      vVar1.Y = iStack_64 + 1;
      vVar1.X = local_68 + 1;
      vVar3.Y = iStack_5c + -2;
      vVar3.X = iStack_60 + -2;
      checkClientArea->UpperLeftCorner = vVar1;
      checkClientArea->LowerRightCorner = vVar3;
    }
    local_48 = r->UpperLeftCorner;
    iStack_60 = (r->LowerRightCorner).X;
    iStack_5c = (r->LowerRightCorner).Y;
    uStack_40 = 0;
    local_68 = local_48.X + 2;
    iStack_64 = local_48.Y + 2;
    iStack_60 = iStack_60 + -2;
    iVar7 = (*(this->super_IGUISkin)._vptr_IGUISkin[2])(this,2);
    iStack_5c = iVar7 + local_48.Y + 4;
    if ((char)local_50 != '\0') {
      if (checkClientArea == (rect<int> *)0x0) {
        if (this->Type == EGST_BURNING_SKIN) {
          local_58.color = local_54.color | 0xffffff;
          SVar8 = video::SColor::getInterpolated(&local_54,&local_58,0.8);
          pIVar9 = this->Driver;
          pp_Var10 = pIVar9->_vptr_IVideoDriver;
          SVar6.color = local_54.color;
          SVar5 = SVar8;
        }
        else {
          local_58.color = local_54.color & 0xff000000;
          SVar8 = video::SColor::getInterpolated(&local_54,&local_58,0.2);
          pIVar9 = this->Driver;
          pp_Var10 = pIVar9->_vptr_IVideoDriver;
          SVar6 = SVar8;
          SVar5.color = local_54.color;
        }
        (*pp_Var10[0x34])(pIVar9,&local_68,(ulong)local_54.color,(ulong)SVar6.color,
                          (ulong)SVar5.color,(ulong)SVar8.color,clip);
      }
      else {
        (checkClientArea->UpperLeftCorner).Y = iStack_5c;
      }
    }
  }
  rVar2.UpperLeftCorner.Y = iStack_64;
  rVar2.UpperLeftCorner.X = local_68;
  rVar2.LowerRightCorner.X = iStack_60;
  rVar2.LowerRightCorner.Y = iStack_5c;
  return rVar2;
}

Assistant:

core::rect<s32> CGUISkin::draw3DWindowBackground(IGUIElement *element,
		bool drawTitleBar, video::SColor titleBarColor,
		const core::rect<s32> &r,
		const core::rect<s32> *clip,
		core::rect<s32> *checkClientArea)
{
	if (!Driver) {
		if (checkClientArea) {
			*checkClientArea = r;
		}
		return r;
	}

	core::rect<s32> rect = r;

	// top border
	rect.LowerRightCorner.Y = rect.UpperLeftCorner.Y + 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);
	}

	// left border
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = rect.UpperLeftCorner.X + 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_HIGH_LIGHT), rect, clip);
	}

	// right border dark outer line
	rect.UpperLeftCorner.X = r.LowerRightCorner.X - 1;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	rect.UpperLeftCorner.Y = r.UpperLeftCorner.Y;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);
	}

	// right border bright innner line
	rect.UpperLeftCorner.X -= 1;
	rect.LowerRightCorner.X -= 1;
	rect.UpperLeftCorner.Y += 1;
	rect.LowerRightCorner.Y -= 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);
	}

	// bottom border dark outer line
	rect.UpperLeftCorner.X = r.UpperLeftCorner.X;
	rect.UpperLeftCorner.Y = r.LowerRightCorner.Y - 1;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_DARK_SHADOW), rect, clip);
	}

	// bottom border bright inner line
	rect.UpperLeftCorner.X += 1;
	rect.LowerRightCorner.X -= 1;
	rect.UpperLeftCorner.Y -= 1;
	rect.LowerRightCorner.Y -= 1;
	if (!checkClientArea) {
		Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);
	}

	// client area for background
	rect = r;
	rect.UpperLeftCorner.X += 1;
	rect.UpperLeftCorner.Y += 1;
	rect.LowerRightCorner.X -= 2;
	rect.LowerRightCorner.Y -= 2;
	if (checkClientArea) {
		*checkClientArea = rect;
	}

	if (!checkClientArea) {
		if (!UseGradient) {
			Driver->draw2DRectangle(getColor(EGDC_3D_FACE), rect, clip);
		} else if (Type == EGST_BURNING_SKIN) {
			const video::SColor c1 = getColor(EGDC_WINDOW).getInterpolated(0xFFFFFFFF, 0.9f);
			const video::SColor c2 = getColor(EGDC_WINDOW).getInterpolated(0xFFFFFFFF, 0.8f);

			Driver->draw2DRectangle(rect, c1, c1, c2, c2, clip);
		} else {
			const video::SColor c2 = getColor(EGDC_3D_SHADOW);
			const video::SColor c1 = getColor(EGDC_3D_FACE);
			Driver->draw2DRectangle(rect, c1, c1, c1, c2, clip);
		}
	}

	// title bar
	rect = r;
	rect.UpperLeftCorner.X += 2;
	rect.UpperLeftCorner.Y += 2;
	rect.LowerRightCorner.X -= 2;
	rect.LowerRightCorner.Y = rect.UpperLeftCorner.Y + getSize(EGDS_WINDOW_BUTTON_WIDTH) + 2;

	if (drawTitleBar) {
		if (checkClientArea) {
			(*checkClientArea).UpperLeftCorner.Y = rect.LowerRightCorner.Y;
		} else {
			// draw title bar
			// if (!UseGradient)
			//	Driver->draw2DRectangle(titleBarColor, rect, clip);
			// else
			if (Type == EGST_BURNING_SKIN) {
				const video::SColor c = titleBarColor.getInterpolated(video::SColor(titleBarColor.getAlpha(), 255, 255, 255), 0.8f);
				Driver->draw2DRectangle(rect, titleBarColor, titleBarColor, c, c, clip);
			} else {
				const video::SColor c = titleBarColor.getInterpolated(video::SColor(titleBarColor.getAlpha(), 0, 0, 0), 0.2f);
				Driver->draw2DRectangle(rect, titleBarColor, c, titleBarColor, c, clip);
			}
		}
	}

	return rect;
}